

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O2

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::BufferSizeTestInstance::prepareDescriptors(BufferSizeTestInstance *this)

{
  Move<vk::Handle<(vk::HandleType)19>_> *this_00;
  Move<vk::Handle<(vk::HandleType)22>_> *this_01;
  VkAllocationCallbacks *pVVar1;
  DeviceInterface *vk;
  VkDevice device;
  DescriptorSetLayoutBuilder *pDVar2;
  DescriptorPoolBuilder *pDVar3;
  DescriptorSetUpdateBuilder *pDVar4;
  VkDescriptorBufferInfo descriptorBufferInfo;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_b8;
  DeviceInterface *local_90;
  DescriptorSetLayoutBuilder local_88;
  Location local_38;
  
  vk = Context::getDeviceInterface((this->super_SizeTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_SizeTestInstance).super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_88);
  pDVar2 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (&local_88,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,0x20);
  pDVar2 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar2,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_b8,pDVar2,vk,device,0);
  pVVar1 = local_b8.m_data.deleter.m_allocator;
  descriptorBufferInfo.range = (VkDeviceSize)local_b8.m_data.deleter.m_device;
  descriptorBufferInfo.buffer.m_internal = local_b8.m_data.object.m_internal;
  descriptorBufferInfo.offset = (VkDeviceSize)local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal._0_4_ = 0;
  local_b8.m_data.object.m_internal._4_4_ = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_00 = &this->m_descriptorSetLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_device = (VkDevice)descriptorBufferInfo.range;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_allocator = pVVar1;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       descriptorBufferInfo.buffer.m_internal;
  (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)descriptorBufferInfo.offset;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_b8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_88);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_b8);
  pDVar3 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&local_b8,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1);
  pDVar3 = ::vk::DescriptorPoolBuilder::addType(pDVar3,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&descriptorBufferInfo,pDVar3,vk,device,1,1);
  local_88.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)descriptorBufferInfo.range;
  local_88.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar1;
  local_88.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descriptorBufferInfo.buffer.m_internal;
  local_88.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descriptorBufferInfo.offset;
  descriptorBufferInfo.buffer.m_internal = 0;
  descriptorBufferInfo.offset = 0;
  descriptorBufferInfo.range = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_88.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)
         local_88.m_immutableSamplerInfos.
         super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       (deUint64)
       local_88.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_88.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&descriptorBufferInfo);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_b8);
  local_90 = vk;
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&descriptorBufferInfo,vk,device,
                    (VkDescriptorPool)
                    (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    object.m_internal,
                    (VkDescriptorSetLayout)
                    (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                    m_data.object.m_internal);
  local_88.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)descriptorBufferInfo.range;
  local_88.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descriptorBufferInfo.buffer.m_internal;
  local_88.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descriptorBufferInfo.offset;
  descriptorBufferInfo.buffer.m_internal = 0;
  descriptorBufferInfo.offset = 0;
  descriptorBufferInfo.range = 0;
  this_01 = &this->m_descriptorSet;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)
       local_88.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
  m_internal = (deUint64)
               local_88.m_immutableSamplerInfos.
               super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
       (deUint64)
       local_88.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
  m_deviceIface =
       (DeviceInterface *)
       local_88.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&descriptorBufferInfo);
  descriptorBufferInfo.range = (this->super_SizeTestInstance).m_resultBufferSizeBytes;
  descriptorBufferInfo.buffer.m_internal =
       (((this->super_SizeTestInstance).m_resultBuffer.
         super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr)->
       m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  descriptorBufferInfo.offset = 0;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_88);
  local_b8.m_data.object.m_internal._0_4_ = 0;
  local_b8.m_data.object.m_internal._4_4_ = 0;
  pDVar4 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     ((DescriptorSetUpdateBuilder *)&local_88,
                      (VkDescriptorSet)
                      (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      object.m_internal,(Location *)&local_b8,
                      VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,(VkBufferView *)&this->m_bufferView);
  local_38.m_binding = 1;
  local_38.m_arrayElement = 0;
  pDVar4 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar4,(VkDescriptorSet)
                             (this_01->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object
                             .m_internal,&local_38,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                      &descriptorBufferInfo);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar4,local_90,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_88);
  return (VkDescriptorSetLayout)
         (this_00->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
}

Assistant:

VkDescriptorSetLayout BufferSizeTestInstance::prepareDescriptors (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

	const VkDescriptorBufferInfo descriptorBufferInfo = makeDescriptorBufferInfo(m_resultBuffer->get(), 0ull, m_resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, &m_bufferView.get())
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorBufferInfo)
		.update(vk, device);

	return *m_descriptorSetLayout;
}